

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateExtensionRegistrationCode
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  long lVar2;
  long lVar3;
  ImmutableExtensionLiteGenerator IStack_68;
  
  lVar2 = 0;
  for (lVar3 = 0; pDVar1 = (this->super_MessageGenerator).descriptor_,
      lVar3 < *(int *)(pDVar1 + 0x78); lVar3 = lVar3 + 1) {
    ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator
              (&IStack_68,(FieldDescriptor *)(*(long *)(pDVar1 + 0x80) + lVar2),this->context_);
    ImmutableExtensionLiteGenerator::GenerateRegistrationCode(&IStack_68,printer);
    ImmutableExtensionLiteGenerator::~ImmutableExtensionLiteGenerator(&IStack_68);
    lVar2 = lVar2 + 0xa8;
  }
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < *(int *)(pDVar1 + 0x48); lVar3 = lVar3 + 1) {
    ImmutableMessageLiteGenerator
              ((ImmutableMessageLiteGenerator *)&IStack_68,
               (Descriptor *)(*(long *)(pDVar1 + 0x50) + lVar2),this->context_);
    GenerateExtensionRegistrationCode((ImmutableMessageLiteGenerator *)&IStack_68,printer);
    ~ImmutableMessageLiteGenerator((ImmutableMessageLiteGenerator *)&IStack_68);
    pDVar1 = (this->super_MessageGenerator).descriptor_;
    lVar2 = lVar2 + 0xa8;
  }
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::
GenerateExtensionRegistrationCode(io::Printer* printer) {
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionLiteGenerator(descriptor_->extension(i), context_)
      .GenerateRegistrationCode(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    ImmutableMessageLiteGenerator(descriptor_->nested_type(i), context_)
      .GenerateExtensionRegistrationCode(printer);
  }
}